

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Graph.cpp
# Opt level: O1

void __thiscall GraphTest::SetUp(GraphTest *this)

{
  Graph<int> *this_00;
  int local_30 [2];
  
  this_00 = &this->graph;
  local_30[1] = 0;
  local_30[0] = 1;
  graph::Graph<int>::add_edge(this_00,local_30 + 1,local_30);
  local_30[1] = 0;
  local_30[0] = 2;
  graph::Graph<int>::add_edge(this_00,local_30 + 1,local_30);
  local_30[1] = 1;
  local_30[0] = 3;
  graph::Graph<int>::add_edge(this_00,local_30 + 1,local_30);
  local_30[1] = 1;
  local_30[0] = 4;
  graph::Graph<int>::add_edge(this_00,local_30 + 1,local_30);
  local_30[1] = 3;
  local_30[0] = 5;
  graph::Graph<int>::add_edge(this_00,local_30 + 1,local_30);
  local_30[1] = 4;
  local_30[0] = 5;
  graph::Graph<int>::add_edge(this_00,local_30 + 1,local_30);
  return;
}

Assistant:

void SetUp() {
        graph.add_edge(0, 1);
        graph.add_edge(0, 2);
        graph.add_edge(1, 3);
        graph.add_edge(1, 4);
        graph.add_edge(3, 5);
        graph.add_edge(4, 5);
    }